

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checks.cc
# Opt level: O0

void __thiscall
rtc::FatalMessage::FatalMessage(FatalMessage *this,char *file,int line,string *result)

{
  ostream *poVar1;
  string *result_local;
  int line_local;
  char *file_local;
  FatalMessage *this_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
  Init(this,file,line);
  poVar1 = std::operator<<((ostream *)this,"Check failed: ");
  poVar1 = std::operator<<(poVar1,(string *)result);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::operator<<(poVar1,"# ");
  if (result != (string *)0x0) {
    std::__cxx11::string::~string((string *)result);
    operator_delete(result);
  }
  return;
}

Assistant:

FatalMessage::FatalMessage(const char* file, int line, std::string* result) {
  Init(file, line);
  stream_ << "Check failed: " << *result << std::endl << "# ";
  delete result;
}